

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::Expression*,unsigned_char>
          (ValidationInfo *this,uchar left,uchar right,Expression *curr,char *text,Function *func)

{
  ostream *poVar1;
  size_t sVar2;
  ostringstream local_1e0 [8];
  ostringstream ss;
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Function *local_48;
  Expression *local_40;
  uchar local_31;
  
  if (left != right) {
    local_48 = func;
    local_40 = curr;
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    local_31 = left;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e0,(char *)&local_31,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," != ",4);
    local_31 = right;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_31,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    if (text == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(text);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,text,sVar2);
    }
    std::__cxx11::stringbuf::str();
    fail<wasm::Expression*,std::__cxx11::string>(this,&local_68,local_40,local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    std::ios_base::~ios_base(local_170);
  }
  return left == right;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }